

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

bool __thiscall Js::DynamicObject::GetHasNoEnumerableProperties(DynamicObject *this)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  JavascriptArray *pJVar4;
  
  plVar1 = *(long **)((this->super_RecyclableObject).type.ptr + 1);
  cVar2 = (**(code **)(*plVar1 + 0x80))(plVar1,this);
  if ((((cVar2 != '\0') &&
       (*(char *)((long)&(this->super_RecyclableObject).type.ptr[1].javascriptLibrary.ptr + 2) ==
        '\x01')) && (bVar3 = HasObjectArray(this), !bVar3)) &&
     ((bVar3 = JavascriptArray::IsNonES5Array(this), !bVar3 ||
      (pJVar4 = VarTo<Js::JavascriptArray,Js::DynamicObject>(this),
      (pJVar4->super_ArrayObject).length == 0)))) {
    return true;
  }
  return false;
}

Assistant:

bool
    DynamicObject::GetHasNoEnumerableProperties()
    {
        if (!this->GetTypeHandler()->EnsureObjectReady(this))
        {
            return false;
        }

        if (!this->GetDynamicType()->GetHasNoEnumerableProperties())
        {
            return false;
        }
        if (HasObjectArray() || (JavascriptArray::IsNonES5Array(this) && VarTo<JavascriptArray>(this)->GetLength() != 0))
        {
            return false;
        }
        return true;
    }